

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorNinePatch.cpp
# Opt level: O0

SharedPtr<Decorator> __thiscall
Rml::DecoratorNinePatchInstancer::InstanceDecorator
          (DecoratorNinePatchInstancer *this,String *param_1,PropertyDictionary *properties,
          DecoratorInstancerInterface *instancer_interface)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__return_storage_ptr__;
  Spritesheet *pSVar1;
  Property *pPVar2;
  NumericValue NVar3;
  reference pvVar4;
  Sprite *_rect_outer;
  undefined8 uVar5;
  element_type *this_00;
  RenderManager *render_manager;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  DecoratorInstancerInterface *in_R8;
  bool bVar7;
  Texture _texture;
  SharedPtr<Decorator> SVar8;
  Array<NumericValue,_4> *local_138;
  undefined1 local_d0 [8];
  SharedPtr<Rml::DecoratorNinePatch> decorator;
  String sprite_name_1;
  undefined1 local_90 [8];
  String sprite_name;
  Sprite *sprite_inner;
  Sprite *sprite_outer;
  int local_58;
  undefined1 local_54 [4];
  int i;
  Array<NumericValue,_4> edges;
  bool edges_set;
  DecoratorInstancerInterface *instancer_interface_local;
  PropertyDictionary *properties_local;
  String *param_1_local;
  DecoratorNinePatchInstancer *this_local;
  
  edges._M_elems[3].number._3_1_ = 0;
  unique0x100003eb = in_R8;
  ::std::array<Rml::NumericValue,_4UL>::array((array<Rml::NumericValue,_4UL> *)local_54);
  for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
    pPVar2 = PropertyDictionary::GetProperty
                       ((PropertyDictionary *)instancer_interface,
                        param_1[3].field_2._M_local_buf[(long)local_58 + 10]);
    NVar3 = Property::GetNumericValue(pPVar2);
    pvVar4 = ::std::array<Rml::NumericValue,_4UL>::operator[]
                       ((array<Rml::NumericValue,_4UL> *)local_54,(long)local_58);
    pvVar4->number = NVar3.number;
    pvVar4->unit = NVar3.unit;
    pvVar4 = ::std::array<Rml::NumericValue,_4UL>::operator[]
                       ((array<Rml::NumericValue,_4UL> *)local_54,(long)local_58);
    if ((pvVar4->number != 0.0) || (NAN(pvVar4->number))) {
      edges._M_elems[3].number._3_1_ = 1;
    }
  }
  sprite_name.field_2._8_8_ = 0;
  pPVar2 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)instancer_interface,param_1[3].field_2._M_local_buf[8]);
  Property::Get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,pPVar2);
  _rect_outer = DecoratorInstancerInterface::GetSprite
                          (stack0xffffffffffffffd0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_90);
  if (_rect_outer == (Sprite *)0x0) {
    uVar5 = ::std::__cxx11::string::c_str();
    Log::Message(LT_WARNING,"Could not find sprite named \'%s\' in ninepatch decorator.",uVar5);
    ::std::shared_ptr<Rml::Decorator>::shared_ptr((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0)
    ;
  }
  ::std::__cxx11::string::~string((string *)local_90);
  _Var6._M_pi = extraout_RDX;
  if (_rect_outer != (Sprite *)0x0) {
    pPVar2 = PropertyDictionary::GetProperty
                       ((PropertyDictionary *)instancer_interface,param_1[3].field_2._M_local_buf[9]
                       );
    __return_storage_ptr__ =
         &decorator.super___shared_ptr<Rml::DecoratorNinePatch,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
    Property::Get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,pPVar2);
    sprite_name.field_2._8_8_ =
         DecoratorInstancerInterface::GetSprite
                   (stack0xffffffffffffffd0,(String *)__return_storage_ptr__);
    bVar7 = (Sprite *)sprite_name.field_2._8_8_ != (Sprite *)0x0;
    if (!bVar7) {
      uVar5 = ::std::__cxx11::string::c_str();
      Log::Message(LT_WARNING,"Could not find sprite named \'%s\' in ninepatch decorator.",uVar5);
      ::std::shared_ptr<Rml::Decorator>::shared_ptr
                ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
    }
    ::std::__cxx11::string::~string
              ((string *)
               &decorator.super___shared_ptr<Rml::DecoratorNinePatch,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    _Var6._M_pi = extraout_RDX_00;
    if (bVar7) {
      if (_rect_outer->sprite_sheet == *(Spritesheet **)(sprite_name.field_2._8_8_ + 0x10)) {
        MakeShared<Rml::DecoratorNinePatch>();
        this_00 = ::std::
                  __shared_ptr_access<Rml::DecoratorNinePatch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Rml::DecoratorNinePatch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_d0);
        uVar5 = sprite_name.field_2._8_8_;
        if ((edges._M_elems[3].number._3_1_ & 1) == 0) {
          local_138 = (Array<NumericValue,_4> *)0x0;
        }
        else {
          local_138 = (Array<NumericValue,_4> *)local_54;
        }
        pSVar1 = _rect_outer->sprite_sheet;
        render_manager = DecoratorInstancerInterface::GetRenderManager(stack0xffffffffffffffd0);
        _texture = TextureSource::GetTexture(&pSVar1->texture_source,render_manager);
        bVar7 = DecoratorNinePatch::Initialise
                          (this_00,&_rect_outer->rectangle,(Rectanglef *)uVar5,local_138,_texture,
                           _rect_outer->sprite_sheet->display_scale);
        if (bVar7) {
          ::std::shared_ptr<Rml::Decorator>::shared_ptr<Rml::DecoratorNinePatch,void>
                    ((shared_ptr<Rml::Decorator> *)this,
                     (shared_ptr<Rml::DecoratorNinePatch> *)local_d0);
        }
        else {
          ::std::shared_ptr<Rml::Decorator>::shared_ptr
                    ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
        }
        ::std::shared_ptr<Rml::DecoratorNinePatch>::~shared_ptr
                  ((shared_ptr<Rml::DecoratorNinePatch> *)local_d0);
        _Var6._M_pi = extraout_RDX_02;
      }
      else {
        Log::Message(LT_WARNING,
                     "The outer and inner sprites in a ninepatch decorator must be from the same sprite sheet."
                    );
        ::std::shared_ptr<Rml::Decorator>::shared_ptr
                  ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
        _Var6._M_pi = extraout_RDX_01;
      }
    }
  }
  SVar8.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  SVar8.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar8.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorNinePatchInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& instancer_interface)
{
	bool edges_set = false;
	Array<NumericValue, 4> edges;
	for (int i = 0; i < 4; i++)
	{
		edges[i] = properties.GetProperty(edge_ids[i])->GetNumericValue();
		if (edges[i].number != 0.0f)
		{
			edges_set = true;
		}
	}

	const Sprite* sprite_outer = nullptr;
	const Sprite* sprite_inner = nullptr;

	{
		const String sprite_name = properties.GetProperty(sprite_outer_id)->Get<String>();
		sprite_outer = instancer_interface.GetSprite(sprite_name);
		if (!sprite_outer)
		{
			Log::Message(Log::LT_WARNING, "Could not find sprite named '%s' in ninepatch decorator.", sprite_name.c_str());
			return nullptr;
		}
	}
	{
		const String sprite_name = properties.GetProperty(sprite_inner_id)->Get<String>();
		sprite_inner = instancer_interface.GetSprite(sprite_name);
		if (!sprite_inner)
		{
			Log::Message(Log::LT_WARNING, "Could not find sprite named '%s' in ninepatch decorator.", sprite_name.c_str());
			return nullptr;
		}
	}

	if (sprite_outer->sprite_sheet != sprite_inner->sprite_sheet)
	{
		Log::Message(Log::LT_WARNING, "The outer and inner sprites in a ninepatch decorator must be from the same sprite sheet.");
		return nullptr;
	}

	auto decorator = MakeShared<DecoratorNinePatch>();

	if (!decorator->Initialise(sprite_outer->rectangle, sprite_inner->rectangle, (edges_set ? &edges : nullptr),
			sprite_outer->sprite_sheet->texture_source.GetTexture(instancer_interface.GetRenderManager()), sprite_outer->sprite_sheet->display_scale))
	{
		return nullptr;
	}

	return decorator;
}